

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O0

void Gia_ManIffTest(Gia_Man_t *pGia,If_LibLut_t *pLib,int fVerbose)

{
  int iVar1;
  int nCos;
  Vec_Int_t *pVVar2;
  uint local_38;
  uint local_34;
  int nLutSize;
  int nDegree;
  Tim_Man_t *pTemp;
  Iff_Man_t *p;
  If_LibLut_t *pIStack_18;
  int fVerbose_local;
  If_LibLut_t *pLib_local;
  Gia_Man_t *pGia_local;
  
  _nLutSize = (Tim_Man_t *)0x0;
  p._4_4_ = fVerbose;
  pIStack_18 = pLib;
  pLib_local = (If_LibLut_t *)pGia;
  iVar1 = Gia_ManLutSizeMax(pGia);
  if (iVar1 < 5) {
    local_38 = 4;
    if (pIStack_18->LutMax == 7) {
      local_34 = 2;
    }
    else {
      if (pIStack_18->LutMax != 10) {
        printf("LUT library for packing 4-LUTs should have 7 or 10 inputs.\n");
        return;
      }
      local_34 = 3;
    }
  }
  else {
    if (6 < iVar1) {
      printf("The LUT size is more than 6.\n");
      return;
    }
    local_38 = 6;
    if (pIStack_18->LutMax == 0xb) {
      local_34 = 2;
    }
    else {
      if (pIStack_18->LutMax != 0x10) {
        printf("LUT library for packing 6-LUTs should have 11 or 16 inputs.\n");
        return;
      }
      local_34 = 3;
    }
  }
  if (p._4_4_ != 0) {
    printf("Performing %d-clustering with %d-LUTs:\n",(ulong)local_34,(ulong)local_38);
  }
  if (*(long *)(pLib_local->pLutDelays[3] + 0xe) == 0) {
    iVar1 = Gia_ManCiNum((Gia_Man_t *)pLib_local);
    nCos = Gia_ManCoNum((Gia_Man_t *)pLib_local);
    _nLutSize = Tim_ManStart(iVar1,nCos);
    *(Tim_Man_t **)(pLib_local->pLutDelays[3] + 0xe) = _nLutSize;
  }
  pTemp = (Tim_Man_t *)
          Gia_ManIffPerform((Gia_Man_t *)pLib_local,pIStack_18,
                            *(Tim_Man_t **)(pLib_local->pLutDelays[3] + 0xe),local_38,local_34);
  if (*(Tim_Man_t **)(pLib_local->pLutDelays[3] + 0xe) == _nLutSize) {
    *(float *)((long)(pLib_local->pLutDelays + 3) + 0x38) = 0.0;
    *(float *)((long)(pLib_local->pLutDelays + 3) + 0x3c) = 0.0;
  }
  Tim_ManStopP((Tim_Man_t **)&nLutSize);
  Vec_IntFreeP((Vec_Int_t **)(pLib_local->pLutDelays[0] + 0x1d));
  pVVar2 = Gia_ManIffSelect((Iff_Man_t *)pTemp);
  *(Vec_Int_t **)(pLib_local->pLutDelays[0] + 0x1d) = pVVar2;
  Gia_ManIffStop((Iff_Man_t *)pTemp);
  if (p._4_4_ != 0) {
    Gia_ManPrintPackingStats((Gia_Man_t *)pLib_local);
  }
  return;
}

Assistant:

void Gia_ManIffTest( Gia_Man_t * pGia, If_LibLut_t * pLib, int fVerbose )
{
    Iff_Man_t * p;
    Tim_Man_t * pTemp = NULL;
    int nDegree = -1;
    int nLutSize = Gia_ManLutSizeMax( pGia );
    if ( nLutSize <= 4 )
    {
        nLutSize = 4;
        if ( pLib->LutMax == 7 )
            nDegree = 2;
        else if ( pLib->LutMax == 10 )
            nDegree = 3;
        else
            { printf( "LUT library for packing 4-LUTs should have 7 or 10 inputs.\n" ); return; }
    }
    else if ( nLutSize <= 6 )
    {
        nLutSize = 6;
        if ( pLib->LutMax == 11 )
            nDegree = 2;
        else if ( pLib->LutMax == 16 )
            nDegree = 3;
        else
            { printf( "LUT library for packing 6-LUTs should have 11 or 16 inputs.\n" ); return; }
    }
    else
    {
        printf( "The LUT size is more than 6.\n" );
        return;
    }
    if ( fVerbose )
        printf( "Performing %d-clustering with %d-LUTs:\n", nDegree, nLutSize );
    // create timing manager
    if ( pGia->pManTime == NULL )
        pGia->pManTime = pTemp = Tim_ManStart( Gia_ManCiNum(pGia), Gia_ManCoNum(pGia) );
    // perform timing computation
    p = Gia_ManIffPerform( pGia, pLib, (Tim_Man_t *)pGia->pManTime, nLutSize, nDegree );
    // remove timing manager
    if ( pGia->pManTime == pTemp )
        pGia->pManTime = NULL;
    Tim_ManStopP( (Tim_Man_t **)&pTemp );
    // derive clustering
    Vec_IntFreeP( &pGia->vPacking );
    pGia->vPacking = Gia_ManIffSelect( p );
    Gia_ManIffStop( p );
    // print statistics
    if ( fVerbose )
        Gia_ManPrintPackingStats( pGia );
}